

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_version.cpp
# Opt level: O0

bool ON_TestVersionNumber
               (uint major,uint minor,uint year,uint month,uint day_of_month,uint platform_branch,
               uint version_as_unsigned_number)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int local_74;
  int local_6c;
  int local_68;
  int local_64;
  uint local_54;
  uint version_ctor_macro;
  uint version_ctor_cpp;
  uint uStack_40;
  bool bParsed;
  uint version_platform;
  uint version_day_of_month;
  uint version_month;
  uint version_year;
  uint version_minor;
  uint version_major;
  uint platform;
  uint max_day_of_month;
  uint platform_branch_local;
  uint day_of_month_local;
  uint month_local;
  uint year_local;
  uint minor_local;
  uint major_local;
  
  platform = platform_branch;
  max_day_of_month = day_of_month;
  platform_branch_local = month;
  day_of_month_local = year;
  month_local = minor;
  year_local = major;
  if ((major == 0) || (0x3f < major)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
               ,0xb9,"","Invalid major parameter");
  }
  else if (minor < 0x80) {
    if ((year < 2000) || (0x832 < year)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                 ,0xc3,"","Invalid year parameter");
    }
    else if ((month == 0) || (0xc < month)) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                 ,200,"","Invalid month parameter");
    }
    else {
      version_major = ON_DaysInMonthOfGregorianYear(year,month);
      if (platform_branch_local == 2) {
        if ((version_major != 0x1c) && ((version_major != 0x1d || ((day_of_month_local & 3) != 0))))
        {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                     ,0xd2,"","ON_DaysInMonthOfGregorianYear() has bug");
          return false;
        }
      }
      else if ((version_major != 0x1e) && (version_major != 0x1f)) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                   ,0xdb,"","ON_DaysInMonthOfGregorianYear() has bug");
        return false;
      }
      if (((max_day_of_month == 0) || (version_major < max_day_of_month)) || (0x1f < version_major))
      {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                   ,0xe2,"","Invalid day_of_month parameter");
      }
      else {
        if (platform == 0) {
          local_54 = 0;
        }
        else {
          local_54 = 2 - (platform & 1);
        }
        version_minor = local_54;
        version_year = 0xffffffff;
        version_month = 0xffffffff;
        version_day_of_month = 0xffffffff;
        version_platform = 0xffffffff;
        uStack_40 = 0xffffffff;
        version_ctor_cpp = 0xffffffff;
        if (version_as_unsigned_number == 0) {
          version_as_unsigned_number =
               ON_VersionNumberConstruct
                         (year_local,month_local,day_of_month_local,platform_branch_local,
                          max_day_of_month,platform);
        }
        bVar1 = ON_VersionNumberParse
                          (version_as_unsigned_number,&version_year,&version_month,
                           &version_day_of_month,&version_platform,&stack0xffffffffffffffc0,
                           &version_ctor_cpp);
        if (bVar1) {
          if ((((version_year == year_local) && (version_month == month_local)) &&
              ((version_day_of_month == day_of_month_local &&
               ((version_platform == platform_branch_local && (uStack_40 == max_day_of_month))))))
             && (version_ctor_cpp == version_minor)) {
            uVar2 = ON_VersionNumberConstruct
                              (year_local,month_local,day_of_month_local,platform_branch_local,
                               max_day_of_month,platform);
            if (uVar2 == version_as_unsigned_number) {
              iVar3 = 0;
              if (1 < platform_branch_local) {
                iVar3 = 0x1f;
              }
              if (platform_branch_local < 3) {
                local_6c = 0;
              }
              else {
                if (day_of_month_local % 400 == 0) {
                  local_64 = 0x1d;
                }
                else {
                  if (day_of_month_local % 100 == 0) {
                    local_68 = 0x1c;
                  }
                  else {
                    local_68 = 0x1c;
                    if ((day_of_month_local & 3) == 0) {
                      local_68 = 0x1d;
                    }
                  }
                  local_64 = local_68;
                }
                local_6c = local_64;
              }
              iVar4 = 0;
              if (3 < platform_branch_local) {
                iVar4 = 0x1f;
              }
              iVar5 = 0;
              if (4 < platform_branch_local) {
                iVar5 = 0x1e;
              }
              iVar6 = 0;
              if (5 < platform_branch_local) {
                iVar6 = 0x1f;
              }
              iVar7 = 0;
              if (6 < platform_branch_local) {
                iVar7 = 0x1e;
              }
              iVar8 = 0;
              if (7 < platform_branch_local) {
                iVar8 = 0x1f;
              }
              iVar9 = 0;
              if (8 < platform_branch_local) {
                iVar9 = 0x1f;
              }
              iVar10 = 0;
              if (9 < platform_branch_local) {
                iVar10 = 0x1e;
              }
              iVar11 = 0;
              if (10 < platform_branch_local) {
                iVar11 = 0x1f;
              }
              iVar12 = 0;
              if (0xb < platform_branch_local) {
                iVar12 = 0x1e;
              }
              if (platform == 0) {
                local_74 = 0;
              }
              else {
                local_74 = 2 - (platform & 1);
              }
              if (((year_local * 0x80 + month_local) * 0x10000 +
                  (day_of_month_local - 2000) * 0x16f +
                  max_day_of_month + iVar3 + local_6c + iVar4 + iVar5 + iVar6 + iVar7 + iVar8 +
                  iVar9 + iVar10 + iVar11 + iVar12) * 4 + -0x80000000 + local_74 ==
                  version_as_unsigned_number) {
                return true;
              }
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                         ,0x129,"","version_as_unsigned_number != ON_VERSION_NUMBER_CTOR().");
            }
            else {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                         ,0x122,"","version_as_unsigned_number != ON_VersionNumberConstruct().");
            }
          }
          else {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                       ,0x113,"","version_as_unsigned_number does not encode version information.");
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
                     ,0x106,"","Invalid version_as_unsigned_number parameter.");
        }
      }
    }
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_version.cpp"
               ,0xbe,"","Invalid minor parameter");
  }
  return false;
}

Assistant:

bool ON_TestVersionNumber(
  unsigned int major,
  unsigned int minor,
  unsigned int year,
  unsigned int month,
  unsigned int day_of_month,
  unsigned int platform_branch,
  unsigned int version_as_unsigned_number
)
{
  for (;;)
  {
    if (major < 1 || major > OPENNURBS_MAX_VERSION_MAJOR)
    {
      ON_ERROR("Invalid major parameter");
      break;
    }
    if (minor > OPENNURBS_MAX_VERSION_MINOR)
    {
      ON_ERROR("Invalid minor parameter");
      break;
    }
    if (year < 2000 || year >= 2099)
    {
      ON_ERROR("Invalid year parameter");
      break;
    }
    if (month < 1 || month > 12)
    {
      ON_ERROR("Invalid month parameter");
      break;
    }
    const unsigned int max_day_of_month = ON_DaysInMonthOfGregorianYear(year, month);
    if (2 == month)
    {
      if (max_day_of_month != 28)
      {
        if (max_day_of_month != 29 || 0 != (year % 4))
        {
          ON_ERROR("ON_DaysInMonthOfGregorianYear() has bug");
          break;
        }
      }
    }
    else
    {
      if (max_day_of_month != 30 && max_day_of_month != 31)
      {
        ON_ERROR("ON_DaysInMonthOfGregorianYear() has bug");
        break;
      }
    }

    if (day_of_month < 1 || day_of_month > max_day_of_month || max_day_of_month > 31)
    {
      ON_ERROR("Invalid day_of_month parameter");
      break;
    }

    const unsigned int platform = (platform_branch > 0) ? (2 - (platform_branch % 2)) : 0;

    unsigned int version_major = 0xFFFFFFFFU;
    unsigned int version_minor = 0xFFFFFFFFU;
    unsigned int version_year = 0xFFFFFFFFU;
    unsigned int version_month = 0xFFFFFFFFU;
    unsigned int version_day_of_month = 0xFFFFFFFFU;
    unsigned int version_platform = 0xFFFFFFFFU;

    if (0 == version_as_unsigned_number)
    {
      version_as_unsigned_number = ON_VersionNumberConstruct(
        major,
        minor,
        year,
        month,
        day_of_month,
        platform_branch
      );
    }

    const bool bParsed = ON_VersionNumberParse(
      version_as_unsigned_number,
      &version_major,
      &version_minor,
      &version_year,
      &version_month,
      &version_day_of_month,
      &version_platform
      );
    if (false == bParsed)
    {
      ON_ERROR("Invalid version_as_unsigned_number parameter.");
      break;
    }

    if (
      version_major != major
      || version_minor != minor
      || version_year != year
      || version_month != month
      || version_day_of_month != day_of_month
      || version_platform != platform
      )
    {
      ON_ERROR("version_as_unsigned_number does not encode version information.");
      break;
    }

    const unsigned int version_ctor_cpp = ON_VersionNumberConstruct(
      major,
      minor,
      year,
      month,
      day_of_month,
      platform_branch
    );

    if (version_ctor_cpp != version_as_unsigned_number)
    {
      ON_ERROR("version_as_unsigned_number != ON_VersionNumberConstruct().");
      break;
    }

    const unsigned int version_ctor_macro = ON_VERSION_NUMBER_CTOR(major, minor, year, month, day_of_month, platform_branch);
    if (version_ctor_macro != version_as_unsigned_number)
    {
      ON_ERROR("version_as_unsigned_number != ON_VERSION_NUMBER_CTOR().");
      break;
    }
    return true;
  }

  return false;
}